

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall chatra::Thread::finish(Thread *this)

{
  SpinLock *pSVar1;
  Frame *this_00;
  __atomic_flag_data_type _Var2;
  int iVar3;
  pointer pFVar4;
  Node *node;
  ReferenceGroup *pRVar5;
  element_type *peVar6;
  Instance *pIVar7;
  Thread *this_01;
  IdPool<chatra::Requester,_chatra::Thread> *this_02;
  _Alloc_hider this_03;
  Class *pCVar8;
  Reference RVar9;
  mapped_type *pmVar10;
  bool bVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  while( true ) {
    pFVar4 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_00 = pFVar4 + -1;
    Frame::popAll(this_00);
    if (pFVar4[-1].exception != (TemporaryObject *)0x0) {
      node = pFVar4[-1].exceptionNode;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unhandled exception","");
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      errorAtNode(&this->super_IErrorReceiver,Error,node,&local_50,&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pCVar8 = getReferClass(((pFVar4[-1].exception)->targetRef).node);
      emitError(this,pCVar8->name,pFVar4[-1].exceptionNode,pFVar4[-1].stackTrace._M_dataplus._M_p);
      Frame::recycle(this_00,pFVar4[-1].exception);
      pFVar4[-1].exception = (TemporaryObject *)0x0;
    }
    if (pFVar4[-1].caughtException != (TemporaryObject *)0x0) {
      Frame::recycle(this_00,pFVar4[-1].caughtException);
      pFVar4[-1].caughtException = (TemporaryObject *)0x0;
    }
    if ((ulong)(((long)(this->frames).
                       super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->frames).
                       super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                       super__Vector_impl_data._M_start >> 4) * -0xf0f0f0f0f0f0f0f) < 3) break;
    popForFinish(this);
  }
  local_50._M_dataplus._M_p._0_4_ = 0x8f;
  RVar9 = AsyncRead<std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>>
          ::
          read<chatra::Reference,chatra::Scope::ref(chatra::StringId)const::_lambda(std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>const&)_1_>
                    ((AsyncRead<std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>>
                      *)(this->runtime->scope)._M_t.
                        super___uniq_ptr_impl<chatra::Scope,_std::default_delete<chatra::Scope>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_chatra::Scope_*,_std::default_delete<chatra::Scope>_>
                        .super__Head_base<0UL,_chatra::Scope_*,_false>._M_head_impl,
                     (anon_class_8_1_ba1d59bf)&local_50);
  if (((RVar9.node)->group->super_Lockable).lockRequester._M_i ==
      (this->super_IdType<chatra::Requester,_chatra::Thread>).id) {
    pRVar5 = (RVar9.node)->group;
    iVar3 = (pRVar5->super_Lockable).lockCount;
    (pRVar5->super_Lockable).lockCount = iVar3 + -1;
    if (iVar3 < 2) {
      LOCK();
      (pRVar5->super_Lockable).lockRequester._M_i = 0xffffffffffffffff;
      UNLOCK();
    }
  }
  if (this->isInteractive == true) {
    checkTransferReq(this);
    LOCK();
    (this->readyToNextInteraction)._M_base._M_i = true;
    UNLOCK();
    peVar6 = (this->runtime->host).super___shared_ptr<chatra::IHost,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar6->_vptr_IHost[5])
              (peVar6,(this->instance->super_IdType<chatra::InstanceId,_chatra::Instance>).id);
  }
  else {
    Frame::popAll((this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1);
    local_50._M_dataplus._M_p = (pointer)0x0;
    pIVar7 = this->instance;
    do {
      LOCK();
      pSVar1 = &pIVar7->lockThreads;
      _Var2 = (pSVar1->flag).super___atomic_flag_base._M_i;
      (pSVar1->flag).super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var2 != false);
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->super_IdType<chatra::Requester,_chatra::Thread>).id;
    pmVar10 = std::__detail::
              _Map_base<chatra::Requester,_std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Requester>,_std::hash<chatra::Requester>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<chatra::Requester,_std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Requester>,_std::hash<chatra::Requester>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->instance->threads,(key_type *)&local_68);
    this_03._M_p = local_50._M_dataplus._M_p;
    this_01 = (pmVar10->_M_t).
              super___uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_>._M_t.
              super__Tuple_impl<0UL,_chatra::Thread_*,_std::default_delete<chatra::Thread>_>.
              super__Head_base<0UL,_chatra::Thread_*,_false>._M_head_impl;
    (pmVar10->_M_t).super___uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_>._M_t
    .super__Tuple_impl<0UL,_chatra::Thread_*,_std::default_delete<chatra::Thread>_>.
    super__Head_base<0UL,_chatra::Thread_*,_false>._M_head_impl = (Thread *)0x0;
    bVar11 = (Thread *)local_50._M_dataplus._M_p != (Thread *)0x0;
    local_50._M_dataplus._M_p = (pointer)this_01;
    if (bVar11) {
      ~Thread((Thread *)this_03._M_p);
      operator_delete(this_03._M_p);
    }
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->super_IdType<chatra::Requester,_chatra::Thread>).id;
    std::
    _Hashtable<chatra::Requester,_std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Requester>,_std::hash<chatra::Requester>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->instance->threads)._M_h);
    (pIVar7->lockThreads).flag.super___atomic_flag_base._M_i = false;
    this_02 = (this->super_IdType<chatra::Requester,_chatra::Thread>).pool;
    if (this_02 != (IdPool<chatra::Requester,_chatra::Thread> *)0x0) {
      IdPool<chatra::Requester,_chatra::Thread>::remove
                (this_02,(char *)(this->super_IdType<chatra::Requester,_chatra::Thread>).id);
      (this->super_IdType<chatra::Requester,_chatra::Thread>).pool =
           (IdPool<chatra::Requester,_chatra::Thread> *)0x0;
    }
    checkTransferReq(this);
    if (this_01 != (Thread *)0x0) {
      ~Thread(this_01);
      operator_delete(this_01);
    }
  }
  return;
}

Assistant:

void Thread::finish() {
	for (;;) {
		auto& f = frames.back();
		f.popAll();

		if (f.exception != nullptr) {
			errorAtNode(*this, ErrorLevel::Error, f.exceptionNode, "unhandled exception", {});
			emitError(getReferClass(f.exception->getRef())->getName(), f.exceptionNode, f.stackTrace.data());

			f.recycle(f.exception);
			f.exception = nullptr;
		}

		if (f.caughtException != nullptr) {
			f.recycle(f.caughtException);
			f.caughtException = nullptr;
		}

		if (frames.size() <= residentialFrameCount)
			break;

		popForFinish();
	}

	auto parser = runtime.scope->ref(StringId::Parser);
	if (parser.lockedBy() == getId())
		parser.unlock();

	if (isInteractive) {
		checkTransferReq();
		readyToNextInteraction = true;
		runtime.host->onInteractiveInstanceReady(instance.getId());
		return;
	}

	// Remove returned value and exceptions
	frames.back().popAll();

	std::unique_ptr<Thread> self;
	{
		std::lock_guard<SpinLock> lock(instance.lockThreads);
		self = std::move(instance.threads[getId()]);
		instance.threads.erase(getId());
	}
	remove();
	checkTransferReq();
	chatra_assert(transferReq.empty());
}